

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O1

long __thiscall dlib::drawable::right(drawable *this)

{
  long lVar1;
  auto_mutex M;
  auto_mutex local_28;
  
  local_28.r = this->m;
  local_28.m = (mutex *)0x0;
  local_28.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_28.r,1);
  lVar1 = (this->rect).r;
  auto_mutex::unlock(&local_28);
  return lVar1;
}

Assistant:

long right (
        ) const 
        { 
            auto_mutex M(m); 
            return rect.right(); 
        }